

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pprinter.cc
# Opt level: O2

string * tinyusdz::print_typed_attr<tinyusdz::Token>
                   (string *__return_storage_ptr__,TypedAttribute<tinyusdz::Token> *attr,
                   string *name,uint32_t indent)

{
  Path *v;
  bool bVar1;
  ostream *poVar2;
  value_type *tok;
  pointer pPVar3;
  long lVar4;
  uint32_t indent_00;
  pointer pPVar5;
  uint32_t extraout_EDX;
  uint32_t extraout_EDX_00;
  uint32_t uVar6;
  uint32_t n;
  uint32_t extraout_EDX_01;
  optional<tinyusdz::Token> pv;
  stringstream ss;
  optional<tinyusdz::Token> local_200;
  string local_1d8;
  stringstream local_1b8 [16];
  ostream local_1a8 [376];
  
  pPVar5 = (pointer)(ulong)indent;
  ::std::__cxx11::stringstream::stringstream(local_1b8);
  bVar1 = TypedAttribute<tinyusdz::Token>::authored(attr);
  if (!bVar1) goto LAB_00247a4a;
  bVar1 = AttrMetas::authored(&attr->_metas);
  uVar6 = extraout_EDX;
  if ((((bVar1) || (attr->_blocked != false)) || ((attr->_attrib).has_value_ != false)) ||
     (bVar1 = TypedAttribute<tinyusdz::Token>::is_value_empty(attr), uVar6 = extraout_EDX_00, bVar1)
     ) {
LAB_002477ca:
    indent_00 = (uint32_t)pPVar5;
    pprint::Indent_abi_cxx11_((string *)&local_200,(pprint *)(ulong)indent,uVar6);
    ::std::operator<<(local_1a8,(string *)&local_200);
    ::std::__cxx11::string::_M_dispose();
    ::std::operator<<(local_1a8,"uniform ");
    value::TypeTraits<tinyusdz::Token>::type_name_abi_cxx11_();
    poVar2 = ::std::operator<<(local_1a8,(string *)&local_200);
    poVar2 = ::std::operator<<(poVar2," ");
    ::std::operator<<(poVar2,(string *)name);
    ::std::__cxx11::string::_M_dispose();
    if (attr->_blocked == true) {
      ::std::operator<<(local_1a8," = None");
    }
    else {
      bVar1 = TypedAttribute<tinyusdz::Token>::is_value_empty(attr);
      if (!bVar1) {
        nonstd::optional_lite::optional<tinyusdz::Token>::optional(&local_200,&attr->_attrib);
        if (local_200.has_value_ == true) {
          poVar2 = ::std::operator<<(local_1a8," = ");
          tok = nonstd::optional_lite::optional<tinyusdz::Token>::value(&local_200);
          ::std::operator<<(poVar2,tok);
        }
        nonstd::optional_lite::optional<tinyusdz::Token>::~optional(&local_200);
      }
    }
    bVar1 = AttrMetas::authored(&attr->_metas);
    if (bVar1) {
      poVar2 = ::std::operator<<(local_1a8," (\n");
      print_attr_metas_abi_cxx11_
                ((string *)&local_200,(tinyusdz *)attr,(AttrMeta *)(ulong)(indent + 1),indent_00);
      poVar2 = ::std::operator<<(poVar2,(string *)&local_200);
      pprint::Indent_abi_cxx11_(&local_1d8,(pprint *)(ulong)indent,n);
      poVar2 = ::std::operator<<(poVar2,(string *)&local_1d8);
      ::std::operator<<(poVar2,")");
      ::std::__cxx11::string::_M_dispose();
      ::std::__cxx11::string::_M_dispose();
    }
    ::std::operator<<(local_1a8,"\n");
    pPVar3 = (attr->_paths).super__Vector_base<tinyusdz::Path,_std::allocator<tinyusdz::Path>_>.
             _M_impl.super__Vector_impl_data._M_start;
    pPVar5 = (attr->_paths).super__Vector_base<tinyusdz::Path,_std::allocator<tinyusdz::Path>_>.
             _M_impl.super__Vector_impl_data._M_finish;
    uVar6 = extraout_EDX_01;
  }
  else {
    pPVar3 = (attr->_paths).super__Vector_base<tinyusdz::Path,_std::allocator<tinyusdz::Path>_>.
             _M_impl.super__Vector_impl_data._M_start;
    pPVar5 = (attr->_paths).super__Vector_base<tinyusdz::Path,_std::allocator<tinyusdz::Path>_>.
             _M_impl.super__Vector_impl_data._M_finish;
    if ((pPVar5 == pPVar3) || (((attr->_attrib).has_value_ & 1U) != 0)) goto LAB_002477ca;
  }
  if (pPVar5 != pPVar3) {
    pprint::Indent_abi_cxx11_((string *)&local_200,(pprint *)(ulong)indent,uVar6);
    ::std::operator<<(local_1a8,(string *)&local_200);
    ::std::__cxx11::string::_M_dispose();
    ::std::operator<<(local_1a8,"uniform ");
    value::TypeTraits<tinyusdz::Token>::type_name_abi_cxx11_();
    poVar2 = ::std::operator<<(local_1a8,(string *)&local_200);
    poVar2 = ::std::operator<<(poVar2," ");
    ::std::operator<<(poVar2,(string *)name);
    ::std::__cxx11::string::_M_dispose();
    ::std::operator<<(local_1a8,".connect = ");
    v = (attr->_paths).super__Vector_base<tinyusdz::Path,_std::allocator<tinyusdz::Path>_>._M_impl.
        super__Vector_impl_data._M_start;
    lVar4 = ((long)(attr->_paths).
                   super__Vector_base<tinyusdz::Path,_std::allocator<tinyusdz::Path>_>._M_impl.
                   super__Vector_impl_data._M_finish - (long)v) / 0xd0;
    if (lVar4 == 0) {
      ::std::operator<<(local_1a8,"[InternalError]");
    }
    else if (lVar4 == 1) {
      ::std::operator<<(local_1a8,v);
    }
    else {
      ::std::operator<<(local_1a8,&attr->_paths);
    }
    ::std::operator<<(local_1a8,"\n");
  }
LAB_00247a4a:
  ::std::__cxx11::stringbuf::str();
  ::std::__cxx11::stringstream::~stringstream(local_1b8);
  return __return_storage_ptr__;
}

Assistant:

std::string print_typed_attr(const TypedAttribute<T> &attr,
                             const std::string &name, const uint32_t indent) {
  std::stringstream ss;

  if (attr.authored()) {

    if (attr.metas().authored() || attr.is_blocked() || attr.has_value() || attr.is_value_empty() || (!attr.is_connection())) {
      ss << pprint::Indent(indent);
      ss << "uniform ";
      ss << value::TypeTraits<T>::type_name() << " " << name;

      if (attr.is_blocked()) {
        ss << " = None";
      } else if (attr.is_value_empty()) {
        // nothing to do
      } else {
        auto pv = attr.get_value();
        if (pv) {
          ss << " = " << pv.value();
        }
      }

      if (attr.metas().authored()) {
        ss << " (\n"
           << print_attr_metas(attr.metas(), indent + 1) << pprint::Indent(indent)
           << ")";
      }
      ss << "\n";
    }

    if (attr.has_connections()) {
      ss << pprint::Indent(indent);
      ss << "uniform ";
      ss << value::TypeTraits<T>::type_name() << " " << name;
      ss << ".connect = ";

      const std::vector<Path> &paths = attr.get_connections();
      if (paths.size() == 1) {
        ss << paths[0];
      } else if (paths.size() == 0) {
        ss << "[InternalError]";
      } else {
        ss << paths;
      }

      ss << "\n";
    }
  }

  return ss.str();
}